

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O1

RDL_cfURF * RDL_findCycleFams(RDL_graph *gra,RDL_sPathInfo *spi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  RDL_cfURF *__ptr;
  RDL_cfam **ppRVar6;
  void *__ptr_00;
  RDL_cfam *pRVar7;
  char *pcVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint y;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong local_70;
  void *local_68;
  
  __ptr = (RDL_cfURF *)malloc(0x10);
  __ptr->alloced = 0x40;
  ppRVar6 = (RDL_cfam **)malloc(0x200);
  __ptr->fams = ppRVar6;
  __ptr->nofFams = 0;
  uVar10 = gra->V;
  __ptr_00 = malloc((ulong)uVar10 * 4);
  if ((ulong)uVar10 != 0) {
    uVar16 = 0;
    do {
      if (gra->V != 0) {
        uVar13 = 0;
        do {
          if (spi->reachable[uVar16][uVar13] == '\x01') {
            puVar9 = gra->degree;
            uVar12 = (ulong)puVar9[uVar13];
            uVar10 = (uint)uVar16;
            y = (uint)uVar13;
            if (puVar9[uVar13] == 0) {
              uVar14 = 0;
            }
            else {
              uVar17 = 0;
              uVar14 = 0;
              do {
                uVar1 = gra->adjList[uVar13][uVar17][0];
                uVar15 = (ulong)uVar1;
                if (spi->reachable[uVar16][uVar15] == '\x01') {
                  uVar2 = spi->dist[uVar16][uVar15];
                  uVar3 = spi->dist[uVar16][uVar13];
                  if (uVar2 + 1 == uVar3) {
                    *(uint *)((long)__ptr_00 + uVar14 * 4) = uVar1;
                    uVar14 = (ulong)((int)uVar14 + 1);
                  }
                  else if (uVar2 != uVar3 + 1) {
                    if (((puVar9[uVar15] < (uint)uVar12) ||
                        ((uVar15 < uVar13 && (puVar9[uVar15] == (uint)uVar12)))) &&
                       (iVar5 = RDL_pathsShareOnlyStart(uVar10,y,uVar1,gra,spi), iVar5 != 0)) {
                      uVar2 = __ptr->nofFams;
                      if (__ptr->alloced == uVar2) {
                        uVar3 = __ptr->alloced * 2;
                        __ptr->alloced = uVar3;
                        ppRVar6 = (RDL_cfam **)realloc(__ptr->fams,(ulong)uVar3 << 3);
                        __ptr->fams = ppRVar6;
                      }
                      ppRVar6 = __ptr->fams;
                      if (ppRVar6 != (RDL_cfam **)0x0) {
                        pRVar7 = (RDL_cfam *)malloc(0x28);
                        pRVar7->r = uVar10;
                        pRVar7->p = y;
                        pRVar7->q = uVar1;
                        pRVar7->x = 0xffffffff;
                        pRVar7->mark = 0;
                        pcVar8 = RDL_findPrototype(uVar10,y,uVar1,0xffffffff,gra,spi);
                        pRVar7->prototype = pcVar8;
                        pRVar7->weight = spi->dist[uVar16][uVar13] + 1 + spi->dist[uVar16][uVar15];
                        __ptr->nofFams = uVar2 + 1;
                        ppRVar6[uVar2] = pRVar7;
                      }
                    }
                  }
                  if (spi->dist[uVar16][uVar15] == 1) {
                    RDL_addEdge(spi->dPaths[uVar16],uVar1,uVar10);
                  }
                }
                uVar17 = uVar17 + 1;
                puVar9 = gra->degree;
                uVar12 = (ulong)puVar9[uVar13];
              } while (uVar17 < uVar12);
            }
            if ((int)uVar14 != 0) {
              uVar12 = 0;
              local_70 = uVar14;
              local_68 = __ptr_00;
              do {
                uVar17 = uVar12 + 1;
                if (uVar17 < uVar14) {
                  uVar1 = *(uint *)((long)__ptr_00 + uVar12 * 4);
                  lVar11 = 1;
                  do {
                    uVar2 = *(uint *)((long)local_68 + lVar11 * 4);
                    iVar5 = RDL_pathsShareOnlyStart(uVar10,uVar1,uVar2,gra,spi);
                    if (iVar5 != 0) {
                      uVar3 = __ptr->nofFams;
                      if (__ptr->alloced == uVar3) {
                        uVar4 = __ptr->alloced * 2;
                        __ptr->alloced = uVar4;
                        ppRVar6 = (RDL_cfam **)realloc(__ptr->fams,(ulong)uVar4 << 3);
                        __ptr->fams = ppRVar6;
                      }
                      ppRVar6 = __ptr->fams;
                      if (ppRVar6 != (RDL_cfam **)0x0) {
                        pRVar7 = (RDL_cfam *)malloc(0x28);
                        pRVar7->r = uVar10;
                        pRVar7->p = uVar1;
                        pRVar7->q = uVar2;
                        pRVar7->x = y;
                        pRVar7->mark = 0;
                        pcVar8 = RDL_findPrototype(uVar10,uVar1,uVar2,y,gra,spi);
                        pRVar7->prototype = pcVar8;
                        pRVar7->weight = spi->dist[uVar16][uVar1] + 2 + spi->dist[uVar16][uVar2];
                        __ptr->nofFams = uVar3 + 1;
                        ppRVar6[uVar3] = pRVar7;
                      }
                    }
                    lVar11 = lVar11 + 1;
                  } while ((int)local_70 != (int)lVar11);
                }
                local_70 = local_70 - 1;
                local_68 = (void *)((long)local_68 + 4);
                uVar12 = uVar17;
              } while (uVar17 != uVar14);
              uVar12 = 0;
              do {
                RDL_addEdge(spi->dPaths[uVar16],y,*(uint *)((long)__ptr_00 + uVar12 * 4));
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < gra->V);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < gra->V);
  }
  free(__ptr_00);
  if (__ptr->fams == (RDL_cfam **)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"Graph is too large, can\'t allocate memory!\n");
    free(__ptr);
    __ptr = (RDL_cfURF *)0x0;
  }
  else {
    uVar10 = __ptr->nofFams;
    __ptr->alloced = uVar10;
    ppRVar6 = (RDL_cfam **)realloc(__ptr->fams,(ulong)uVar10 * 8);
    __ptr->fams = ppRVar6;
    qsort(ppRVar6,(ulong)uVar10,8,RDL_cycleFamsComp);
  }
  return __ptr;
}

Assistant:

RDL_cfURF *RDL_findCycleFams(RDL_graph *gra, RDL_sPathInfo *spi)
{
  RDL_cfURF *rc = malloc(sizeof(*rc));
  /*number of CFs is at most 2m^2+vn (Vismara Lemma 3)*/

  rc->alloced = 64;
  rc->fams = malloc(rc->alloced * sizeof(*rc->fams));
  rc->nofFams = 0;
  RDL_vismara(rc, gra, spi);

  if (!rc->fams) {
    RDL_outputFunc(RDL_ERROR, "Graph is too large, can't allocate memory!\n");
    free(rc);
    return NULL;
  }

  rc->alloced = rc->nofFams;
  rc->fams = realloc(rc->fams, rc->alloced * sizeof(*rc->fams));

  /* sort by size */
  qsort(rc->fams, rc->nofFams, sizeof(*rc->fams), RDL_cycleFamsComp);
  return rc;
}